

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall
stackjit::FunctionDefinition::FunctionDefinition
          (FunctionDefinition *this,string *name,
          vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *parameters,
          Type *returnType,BytePtr entryPoint,ClassType *classType,AccessModifier accessModifier,
          bool isConstructor)

{
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  Type **local_70;
  ClassType *local_68;
  __normal_iterator<const_stackjit::Type_**,_std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>_>
  local_60;
  const_iterator local_58;
  byte local_39;
  ClassType *pCStack_38;
  bool isConstructor_local;
  ClassType *classType_local;
  BytePtr entryPoint_local;
  Type *returnType_local;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *parameters_local;
  string *name_local;
  FunctionDefinition *this_local;
  
  local_39 = isConstructor;
  pCStack_38 = classType;
  classType_local = (ClassType *)entryPoint;
  entryPoint_local = (BytePtr)returnType;
  returnType_local = (Type *)parameters;
  parameters_local = (vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *)name
  ;
  name_local = &this->mName;
  std::__cxx11::string::string((string *)this,(string *)name);
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            (&this->mParameters,parameters);
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            (&this->mCallParameters);
  this->mReturnType = (Type *)entryPoint_local;
  this->mEntryPoint = (BytePtr)classType_local;
  this->mIsManaged = false;
  this->mIsMemberFunction = pCStack_38 != (ClassType *)0x0;
  this->mClassType = pCStack_38;
  std::__cxx11::string::string((string *)&this->mMemberName);
  this->mAccessModifier = accessModifier;
  this->mIsConstructor = (bool)(local_39 & 1);
  this->mIsVirtual = false;
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::operator=
            (&this->mCallParameters,&this->mParameters);
  if ((this->mIsMemberFunction & 1U) != 0) {
    local_60._M_current =
         (Type **)std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::
                  begin(&this->mParameters);
    __gnu_cxx::
    __normal_iterator<stackjit::Type_const*const*,std::vector<stackjit::Type_const*,std::allocator<stackjit::Type_const*>>>
    ::__normal_iterator<stackjit::Type_const**>
              ((__normal_iterator<stackjit::Type_const*const*,std::vector<stackjit::Type_const*,std::allocator<stackjit::Type_const*>>>
                *)&local_58,&local_60);
    local_68 = this->mClassType;
    local_70 = (Type **)std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                        ::insert(&this->mParameters,local_58,(value_type *)&local_68);
    std::__cxx11::string::operator=((string *)&this->mMemberName,(string *)this);
    __rhs = ClassType::className_abi_cxx11_(pCStack_38);
    std::operator+(local_b0,(char *)__rhs);
    std::operator+(local_90,local_b0);
    std::__cxx11::string::operator=((string *)this,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_b0);
  }
  return;
}

Assistant:

FunctionDefinition::FunctionDefinition(
		std::string name,
		std::vector<const Type*> parameters,
		const Type* returnType,
		BytePtr entryPoint,
		const ClassType* classType,
		AccessModifier accessModifier,
		bool isConstructor)
	    : mName(name),
	      mParameters(parameters),
	      mReturnType(returnType),
	      mEntryPoint(entryPoint),
	      mIsManaged(false),
		  mIsMemberFunction(classType != nullptr),
		  mClassType(classType),
		  mAccessModifier(accessModifier),
		  mIsConstructor(isConstructor),
		  mIsVirtual(false) {
		mCallParameters = mParameters;
		if (mIsMemberFunction) {
			mParameters.insert(mParameters.begin(), mClassType);
			mMemberName = mName;
			mName = classType->className() + "::" + mName;
		}
	}